

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputreader.cpp
# Opt level: O1

void __thiscall InputReader::readFile(InputReader *this,char *inpFile,Network *network)

{
  char cVar1;
  FileError *this_00;
  undefined1 local_420 [8];
  PropertyParser propertyParser;
  ifstream fin;
  undefined1 local_28 [8];
  ObjectParser objectParser;
  
  this->section = -1;
  std::ifstream::ifstream
            (&propertyParser.tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,inpFile,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    ObjectParser::ObjectParser((ObjectParser *)local_28,network);
    parseFile(this,(istream *)
                   &propertyParser.tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(InputParser *)local_28);
    PropertyParser::PropertyParser((PropertyParser *)local_420,network);
    parseFile(this,(istream *)
                   &propertyParser.tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(InputParser *)local_420);
    std::ifstream::close();
    local_420 = (undefined1  [8])&PTR__PropertyParser_00157490;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&propertyParser.controlParser.timeSetting);
    std::__cxx11::istringstream::~istringstream((istringstream *)&propertyParser.field_0x10);
    std::ios_base::~ios_base((ios_base *)&propertyParser.controlParser.field_0x70);
    InputParser::~InputParser((InputParser *)local_420);
    InputParser::~InputParser((InputParser *)local_28);
    std::ifstream::~ifstream
              (&propertyParser.tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  this_00 = (FileError *)__cxa_allocate_exception(0x30);
  FileError::FileError(this_00,1);
  __cxa_throw(this_00,&FileError::typeinfo,ENerror::~ENerror);
}

Assistant:

void InputReader::readFile(const char* inpFile, Network* network)
{
    // ... initialize current input section

    section = -1;

    // ... open the input file

    ifstream fin(inpFile, ios::in);
    if (!fin.is_open()) throw FileError(FileError::CANNOT_OPEN_INPUT_FILE);
    try
    {
        // ... parse object names from the file

        ObjectParser objectParser(network);
        parseFile(fin, objectParser);

        // ... parse object properties from the file

        PropertyParser propertyParser(network);
        parseFile(fin, propertyParser);
        fin.close();
    }

    // ... catch and re-throw any exception thrown by the parsing process

    catch (...)
    {
        fin.close();
        throw;
    }
}